

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

bool __thiscall pbrt::RGBColorSpace::operator==(RGBColorSpace *this,RGBColorSpace *cs)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->r).super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (cs->r).super_Tuple2<pbrt::Point2,_float>;
  uVar1 = vcmpps_avx512vl(auVar2,auVar6,0);
  if (((((~(ushort)uVar1 & 3) == 0) &&
       (auVar3._8_8_ = 0, auVar3._0_8_ = (this->g).super_Tuple2<pbrt::Point2,_float>,
       auVar7._8_8_ = 0, auVar7._0_8_ = (cs->g).super_Tuple2<pbrt::Point2,_float>,
       uVar1 = vcmpps_avx512vl(auVar3,auVar7,0), (~(ushort)uVar1 & 3) == 0)) &&
      (auVar4._8_8_ = 0, auVar4._0_8_ = (this->b).super_Tuple2<pbrt::Point2,_float>,
      auVar8._8_8_ = 0, auVar8._0_8_ = (cs->b).super_Tuple2<pbrt::Point2,_float>,
      uVar1 = vcmpps_avx512vl(auVar4,auVar8,0), (~(ushort)uVar1 & 3) == 0)) &&
     (auVar5._8_8_ = 0, auVar5._0_8_ = (this->w).super_Tuple2<pbrt::Point2,_float>, auVar9._8_8_ = 0
     , auVar9._0_8_ = (cs->w).super_Tuple2<pbrt::Point2,_float>,
     uVar1 = vcmpps_avx512vl(auVar5,auVar9,0), (~(ushort)uVar1 & 3) == 0)) {
    return this->rgbToSpectrumTable == cs->rgbToSpectrumTable;
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const Child<T> &c) const { return x == c.x && y == c.y; }